

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_rope_f32(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  float *cache;
  uint *puVar1;
  long lVar2;
  long lVar3;
  float ext_factor;
  float freq_scale;
  float fVar4;
  int32_t iVar5;
  float mscale;
  int32_t iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  undefined4 uVar11;
  uint uVar12;
  int32_t iVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  ggml_tensor *pgVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  long ne0;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  char *pcVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  undefined8 uVar44;
  int64_t i0_4;
  long lVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  int64_t i0;
  long lVar50;
  long lVar51;
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float theta_scale;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long local_218;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1c8;
  float *local_1c0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f0;
  float corr_dims [2];
  int sections [4];
  
  ext_factor = (float)dst->op_params[7];
  freq_scale = (float)dst->op_params[6];
  pgVar14 = dst->src[1];
  pgVar15 = dst->src[0];
  fVar4 = (float)dst->op_params[5];
  iVar33 = dst->op_params[1];
  uVar49 = (ulong)iVar33;
  pgVar16 = dst->src[2];
  iVar5 = dst->op_params[9];
  mscale = (float)dst->op_params[8];
  uVar12 = dst->op_params[2];
  iVar13 = dst->op_params[4];
  sections._0_8_ = *(undefined8 *)(dst->op_params + 0xb);
  sections._8_8_ = *(undefined8 *)(dst->op_params + 0xd);
  iVar6 = dst->op_params[10];
  if (pgVar15->nb[0] == 4) {
    sVar17 = pgVar15->nb[2];
    sVar18 = pgVar15->nb[3];
    sVar19 = pgVar15->nb[1];
    ne0 = dst->ne[0];
    sVar20 = dst->nb[0];
    iVar32 = params->nth;
    uVar34 = dst->ne[1];
    uVar21 = dst->ne[2];
    uVar22 = dst->ne[3];
    sVar23 = dst->nb[1];
    sVar24 = dst->nb[2];
    sVar25 = dst->nb[3];
    iVar38 = params->ith;
    iVar31 = ggml_nrows(dst);
    if (ne0 < (long)uVar49) {
      pcVar36 = "n_dims <= ne0";
      uVar44 = 0x1406;
    }
    else if ((uVar49 & 1) == 0) {
      iVar32 = (iVar32 + -1 + iVar31) / iVar32;
      iVar37 = iVar32 * iVar38;
      iVar32 = iVar32 + iVar37;
      if (iVar31 <= iVar32) {
        iVar32 = iVar31;
      }
      theta_scale = powf(fVar4,-2.0 / (float)iVar33);
      ggml_rope_yarn_corr_dims(fVar4,iVar5,iVar6,iVar33,iVar13,corr_dims);
      if (((((uVar12 & 8) == 0) || (0 < sections[0])) || (0 < sections[1])) || (0 < sections[2])) {
        if ((uVar12 == 0x18) && (ne0 / 2 != uVar49)) {
          pcVar36 = "n_dims == ne0/2";
          uVar44 = 0x1421;
        }
        else {
          if (pgVar16 == (ggml_tensor *)0x0) {
            local_1c0 = (float *)0x0;
LAB_0013bf01:
            lVar41 = (long)(iVar33 >> 1) << 2;
            local_180 = 0;
            local_198 = 0;
            lVar46 = (ne0 + 0x10) * (long)iVar38;
            pvVar26 = pgVar14->data;
            fVar4 = (float)((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
            uVar34 = ~((long)uVar34 >> 0x3f) & uVar34;
            iVar33 = 0;
            local_178 = uVar49 * 2;
            lVar2 = lVar46 * 4;
            lVar3 = lVar2 + 4;
            uVar48 = 0;
            local_170 = sVar20 * uVar49 + 4;
            local_188 = uVar49 * 4;
            lVar50 = uVar49 * 6;
            local_190 = lVar41;
            local_168 = local_188;
            do {
              if (uVar48 == (~((long)uVar22 >> 0x3f) & uVar22)) {
                return;
              }
              local_108 = local_178;
              local_110 = local_170;
              local_118 = local_168;
              local_120 = local_188;
              local_130 = local_180;
              local_138 = local_190;
              local_140 = local_198;
              local_128 = lVar41;
              local_100 = lVar50;
              for (uVar40 = 0; uVar40 != (~((long)uVar21 >> 0x3f) & uVar21); uVar40 = uVar40 + 1) {
                pvVar27 = params->wdata;
                cache = (float *)((long)pvVar27 + lVar46 * 4);
                iVar38 = *(int *)((long)pvVar26 + uVar40 * 4);
                if ((uVar12 & 8) == 0) {
                  ggml_rope_cache_init
                            ((float)iVar38,freq_scale,local_1c0,corr_dims,ne0,ext_factor,mscale,
                             cache,fVar4,theta_scale);
                }
                else {
                  ggml_mrope_cache_init
                            ((float)iVar38,(float)*(int *)((long)pvVar26 + uVar21 * 4 + uVar40 * 4),
                             (float)*(int *)((long)pvVar26 + uVar21 * 8 + uVar40 * 4),
                             (float)*(int *)((long)pvVar26 + uVar21 * 0xc + uVar40 * 4),sections,
                             uVar12 == 0x18,freq_scale,local_1c0,corr_dims,ne0,ext_factor,mscale,
                             cache,fVar4,theta_scale);
                }
                auVar30 = _DAT_00150580;
                local_1e0 = local_100;
                local_1e8 = local_108;
                iVar31 = (int)uVar34 + iVar33;
                local_1d8 = local_110;
                local_1f0 = local_118;
                local_f0 = local_128;
                local_218 = local_130;
                local_1c8 = local_138;
                lVar35 = local_140;
                lVar47 = local_120;
                iVar38 = iVar33;
                for (uVar42 = 0; iVar33 = iVar31, uVar42 != uVar34; uVar42 = uVar42 + 1) {
                  iVar33 = iVar38 + 1;
                  if (iVar37 <= iVar38) {
                    if (iVar32 <= iVar38) break;
                    if ((uVar12 & 10) == 0) {
                      lVar43 = 0;
                      lVar39 = local_218;
                      while (lVar43 < (long)uVar49) {
                        auVar56._8_8_ = 0;
                        auVar56._0_8_ = *(ulong *)(cache + lVar43);
                        uVar10 = *(uint *)((long)pgVar15->data + lVar43 * 4 + lVar35 + 4);
                        auVar53._0_4_ = uVar10 ^ 0x80000000;
                        auVar53._4_4_ = 0x80000000;
                        auVar53._8_4_ = 0x80000000;
                        auVar53._12_4_ = 0x80000000;
                        auVar53 = vpermt2ps_avx512vl(ZEXT416(uVar10),auVar30,auVar53);
                        auVar54 = vshufps_avx(auVar56,auVar56,0xe1);
                        auVar55._0_4_ = auVar54._0_4_ * auVar53._0_4_;
                        auVar55._4_4_ = auVar54._4_4_ * auVar53._4_4_;
                        auVar55._8_4_ = auVar54._8_4_ * auVar53._8_4_;
                        auVar55._12_4_ = auVar54._12_4_ * auVar53._12_4_;
                        uVar11 = *(undefined4 *)((long)pgVar15->data + lVar43 * 4 + lVar35);
                        auVar54._4_4_ = uVar11;
                        auVar54._0_4_ = uVar11;
                        auVar54._8_4_ = uVar11;
                        auVar54._12_4_ = uVar11;
                        auVar54 = vfmadd231ps_avx512vl(auVar55,auVar56,auVar54);
                        lVar43 = lVar43 + 2;
                        uVar44 = vmovlps_avx(auVar54);
                        *(undefined8 *)((long)dst->data + lVar39) = uVar44;
                        lVar39 = lVar39 + sVar20 * 2;
                      }
                    }
                    else if (uVar12 == 0x18) {
                      lVar51 = 0;
                      lVar39 = local_1f0;
                      lVar43 = local_218;
                      lVar45 = lVar35;
                      while (lVar51 < (long)uVar49) {
                        fVar7 = *(float *)((long)pvVar27 + lVar51 * 4 + lVar3);
                        fVar8 = *(float *)((long)pvVar27 + lVar51 * 4 + lVar2);
                        pvVar28 = dst->data;
                        puVar1 = (uint *)((long)pgVar15->data + lVar45);
                        lVar45 = lVar45 + 4;
                        fVar9 = *(float *)((long)pgVar15->data + lVar51 * 2 + lVar47);
                        lVar51 = lVar51 + 2;
                        auVar54 = ZEXT416(*puVar1);
                        auVar53 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar8));
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar7));
                        *(int *)((long)pvVar28 + lVar43) = auVar53._0_4_;
                        lVar43 = lVar43 + sVar20;
                        *(int *)((long)pvVar28 + lVar39) = auVar54._0_4_;
                        lVar39 = lVar39 + sVar20;
                      }
                    }
                    else {
                      lVar51 = 0;
                      lVar39 = local_f0;
                      lVar43 = local_218;
                      lVar45 = lVar35;
                      while (lVar51 < (long)uVar49) {
                        fVar7 = *(float *)((long)pvVar27 + lVar51 * 4 + lVar3);
                        fVar8 = *(float *)((long)pvVar27 + lVar51 * 4 + lVar2);
                        pvVar28 = dst->data;
                        puVar1 = (uint *)((long)pgVar15->data + lVar45);
                        lVar45 = lVar45 + 4;
                        fVar9 = *(float *)((long)pgVar15->data + lVar51 * 2 + local_1c8);
                        lVar51 = lVar51 + 2;
                        auVar54 = ZEXT416(*puVar1);
                        auVar53 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar8));
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar7));
                        *(int *)((long)pvVar28 + lVar43) = auVar53._0_4_;
                        lVar43 = lVar43 + sVar20;
                        *(int *)((long)pvVar28 + lVar39) = auVar54._0_4_;
                        lVar39 = lVar39 + sVar20;
                      }
                    }
                    lVar39 = local_1d8;
                    lVar43 = lVar47;
                    uVar52 = uVar49;
                    if (uVar12 == 0x18) {
                      lVar39 = local_1e0;
                      lVar43 = local_1e8;
                      while ((long)uVar52 < ne0) {
                        fVar7 = *(float *)((long)pvVar27 + uVar52 * 4 + lVar3);
                        fVar8 = *(float *)((long)pvVar27 + uVar52 * 4 + lVar2);
                        pvVar28 = dst->data;
                        lVar51 = (long)uVar52 >> 1;
                        uVar52 = uVar52 + 2;
                        lVar51 = lVar51 * sVar20;
                        fVar9 = *(float *)((long)pgVar15->data + lVar39);
                        puVar1 = (uint *)((long)pgVar15->data + lVar43);
                        lVar43 = lVar43 + 4;
                        lVar39 = lVar39 + 4;
                        lVar45 = uVar42 * sVar23 + uVar40 * sVar24 + uVar48 * sVar25;
                        auVar54 = ZEXT416(*puVar1);
                        auVar53 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar8));
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar9)),auVar54,
                                                  ZEXT416((uint)fVar7));
                        *(int *)((long)pvVar28 + lVar51 + lVar45) = auVar53._0_4_;
                        *(int *)((long)pvVar28 + uVar49 * 4 + lVar51 + lVar45) = auVar54._0_4_;
                      }
                    }
                    else {
                      for (; (long)uVar52 < ne0; uVar52 = uVar52 + 2) {
                        pvVar28 = pgVar15->data;
                        pvVar29 = dst->data;
                        *(undefined4 *)((long)pvVar29 + lVar39 + -4) =
                             *(undefined4 *)((long)pvVar28 + lVar43);
                        lVar45 = lVar43 + 4;
                        lVar43 = lVar43 + 8;
                        *(undefined4 *)((long)pvVar29 + lVar39) =
                             *(undefined4 *)((long)pvVar28 + lVar45);
                        lVar39 = lVar39 + sVar20 * 2;
                      }
                    }
                  }
                  lVar35 = lVar35 + sVar19;
                  local_1c8 = local_1c8 + sVar19;
                  local_218 = local_218 + sVar23;
                  local_f0 = local_f0 + sVar23;
                  lVar47 = lVar47 + sVar19;
                  local_1f0 = local_1f0 + sVar23;
                  local_1d8 = local_1d8 + sVar23;
                  local_1e8 = local_1e8 + sVar19;
                  local_1e0 = local_1e0 + sVar19;
                  iVar38 = iVar33;
                }
                local_140 = local_140 + sVar17;
                local_138 = local_138 + sVar17;
                local_130 = local_130 + sVar24;
                local_128 = local_128 + sVar24;
                local_120 = local_120 + sVar17;
                local_118 = local_118 + sVar24;
                local_110 = local_110 + sVar24;
                local_108 = local_108 + sVar17;
                local_100 = local_100 + sVar17;
              }
              uVar48 = uVar48 + 1;
              local_180 = local_180 + sVar25;
              lVar41 = lVar41 + sVar25;
              local_168 = local_168 + sVar25;
              local_170 = local_170 + sVar25;
              local_198 = local_198 + sVar18;
              local_190 = local_190 + sVar18;
              local_188 = local_188 + sVar18;
              local_178 = local_178 + sVar18;
              lVar50 = lVar50 + sVar18;
            } while( true );
          }
          if (pgVar16->type == GGML_TYPE_F32) {
            if ((long)(iVar33 >> 1) <= pgVar16->ne[0]) {
              local_1c0 = (float *)pgVar16->data;
              goto LAB_0013bf01;
            }
            pcVar36 = "src2->ne[0] >= n_dims / 2";
            uVar44 = 0x1427;
          }
          else {
            pcVar36 = "src2->type == GGML_TYPE_F32";
            uVar44 = 0x1426;
          }
        }
      }
      else {
        pcVar36 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar44 = 0x141d;
      }
    }
    else {
      pcVar36 = "n_dims % 2 == 0";
      uVar44 = 0x1407;
    }
  }
  else {
    pcVar36 = "nb00 == sizeof(float)";
    uVar44 = 0x13ff;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar44,"GGML_ASSERT(%s) failed",pcVar36);
}

Assistant:

static void ggml_compute_forward_rope_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];

    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);

    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb00 == sizeof(float));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;  // ggml_rope_multi, multimodal rotary position embedding
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) { // batch
        for (int64_t i2 = 0; i2 < ne2; i2++) { // seq-len

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) { // attn-heads
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision){
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims];

                            dst_data[0]      = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = src[0];
                            const float x1 = src[n_dims/2];

                            dst_data[0]        = x0*cos_theta - x1*sin_theta;
                            dst_data[n_dims/2] = x0*sin_theta + x1*cos_theta;
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = src[0];
                        const float x1 = src[1];

                        dst_data[0] = x0*cos_theta - x1*sin_theta;
                        dst_data[1] = x0*sin_theta + x1*cos_theta;
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = src[0];
                        const float x1 = src[n_dims];

                        dst_data[0]      = x0*cos_theta - x1*sin_theta;
                        dst_data[n_dims] = x0*sin_theta + x1*cos_theta;
                    }
                } else {
                    // fill the remain channels with data from src tensor
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const float * const src = (float *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        float * dst_data  = (float *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}